

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.c
# Opt level: O0

int asn1_get_nonzero_mpi(uchar **p,uchar *end,mbedtls_mpi *X)

{
  int iVar1;
  int ret;
  mbedtls_mpi *X_local;
  uchar *end_local;
  uchar **p_local;
  
  p_local._4_4_ = mbedtls_asn1_get_mpi(p,end,X);
  if (p_local._4_4_ == 0) {
    iVar1 = mbedtls_mpi_cmp_int(X,0);
    if (iVar1 == 0) {
      p_local._4_4_ = -0x3d00;
    }
    else {
      p_local._4_4_ = 0;
    }
  }
  return p_local._4_4_;
}

Assistant:

static int asn1_get_nonzero_mpi( unsigned char **p,
                                 const unsigned char *end,
                                 mbedtls_mpi *X )
{
    int ret;

    ret = mbedtls_asn1_get_mpi( p, end, X );
    if( ret != 0 )
        return( ret );

    if( mbedtls_mpi_cmp_int( X, 0 ) == 0 )
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT );

    return( 0 );
}